

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_2UL>
  *pHVar1;
  size_t *psVar2;
  atomic<unsigned_long> *paVar3;
  char *pcVar4;
  uint uVar5;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar6;
  PrimRefMB *pPVar7;
  MemoryMonitorInterface *pMVar8;
  PrimRefVector pmVar9;
  ThreadLocal2 *pTVar10;
  NodeRefPtr<4> this_00;
  Scene *pSVar11;
  Geometry *pGVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  BBox1f BVar22;
  BBox1f BVar23;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar24;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar25;
  undefined8 uVar26;
  char cVar27;
  mvector<PrimRefMB> *prims;
  __uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
  _Var28;
  void *pvVar29;
  long lVar30;
  long lVar31;
  undefined8 *puVar32;
  runtime_error *prVar33;
  int iVar34;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar35;
  size_t sVar36;
  float *pfVar37;
  unsigned_long uVar38;
  range<unsigned_long> *prVar39;
  int iVar40;
  char *pcVar41;
  BuildRecord *pBVar42;
  unsigned_long uVar43;
  size_t sVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  size_t i_4;
  ulong uVar48;
  size_t i;
  ulong uVar49;
  SetMB *this_01;
  size_t i_6;
  BBox1f *pBVar50;
  ulong uVar51;
  bool bVar52;
  bool bVar53;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  float fVar58;
  float fVar59;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar67;
  float fVar68;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar69;
  float fVar73;
  float fVar74;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar75;
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar86;
  float fVar87;
  undefined1 auVar85 [16];
  float fVar88;
  float fVar90;
  float fVar91;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar89;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar92;
  float fVar93;
  undefined1 local_1f38 [16];
  undefined8 uStack_1f30;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1f08 [16];
  PrimRefVector lprims;
  undefined1 local_1ee8 [8];
  undefined1 auStack_1ee0 [8];
  float local_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  undefined1 local_1ec8 [8];
  undefined8 uStack_1ec0;
  NodeRecordMB4D *local_1eb8;
  BuildRecord *local_1eb0;
  vuint<4> vprimID;
  vuint<4> vgeomID;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1e88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e80;
  undefined4 local_1e6c;
  float local_1e68;
  float fStack_1e64;
  undefined1 auStack_1e60 [8];
  Vec3vf<4> vb1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e28 [9];
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  BBox<embree::Vec3fa> bi;
  Vec3vf<4> vc1;
  unsigned_long local_1cc8;
  unsigned_long uStack_1cc0;
  Vec3vf<4> vc0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c48 [5];
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1bf8;
  undefined1 local_1ba8 [16];
  undefined1 local_1b98 [16];
  BBox<embree::Vec3fa> blower0;
  unsigned_long local_1ac8;
  unsigned_long local_1ac0;
  BBox<embree::Vec3fa> bupper1;
  Vec3vf<4> va1;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1978;
  BuildRecordSplit current;
  NodeRecordMB4D values [16];
  LocalChildListSplit children;
  
  local_1eb8 = __return_storage_ptr__;
  if ((this->cfg).maxDepth < in->depth) {
    puVar32 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&children,"depth limit reached",(allocator *)values);
    *puVar32 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar32 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar32 + 2),(string *)&children);
    __cxa_throw(puVar32,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  children.children.items[0].super_BuildRecord._8_8_ =
       children.children.items[0].super_BuildRecord.depth;
  children.children.items[0].super_BuildRecord.depth = in->depth;
  SetMB::SetMB(&children.children.items[0].super_BuildRecord.prims,&in->prims);
  findFallback((Split *)values,this,&in->prims);
  BuildRecord::BuildRecord(&current.super_BuildRecord,(BuildRecord *)&children);
  auVar85 = values[0]._0_16_;
  current.split.sah = (float)values[0].ref.ptr;
  current.split.dim = (int)values[0].ref.ptr._4_4_;
  current.split.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)values[0]._8_4_;
  current.split.data = values[0]._12_4_;
  uVar26 = current.split._8_8_;
  current.split.mapping.num = values[0].lbounds.bounds0.lower.field_0._0_8_;
  current.split.mapping.ofs.field_0._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
  current.split.mapping.scale.field_0._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
  current.split.mapping.scale.field_0._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
  uVar43 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if (current.super_BuildRecord.depth == 1) {
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end ==
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin) {
      bVar52 = false;
      uVar43 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
    }
    else {
      lVar30 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin * 0x50 + 0x44;
      fVar76 = INFINITY;
      fVar82 = -INFINITY;
      for (uVar38 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
          uVar38 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
          uVar38 = uVar38 + 1) {
        fVar81 = *(float *)((long)(current.super_BuildRecord.prims.prims)->items + lVar30 + -4);
        if (fVar81 <= fVar76) {
          fVar76 = fVar81;
        }
        fVar81 = *(float *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0
                                   .lower.field_0 + lVar30);
        if (fVar81 <= fVar82) {
          fVar81 = fVar82;
        }
        fVar82 = fVar81;
        lVar30 = lVar30 + 0x50;
      }
      bVar52 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower < fVar76 ||
               fVar82 < current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    }
  }
  else {
    bVar52 = false;
  }
  current.split._8_8_ = uVar26;
  if (((current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar43 <=
        (this->cfg).maxLeafSize) && (current.split.data = auVar85._12_4_, current.split.data < 2))
     && (!bVar52)) {
    uVar51 = (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar43) + 3 >> 2;
    va1.field_0._0_8_ = uVar51 * 0x140;
    this_00.ptr = (size_t)(alloc.talloc1)->parent;
    values[0]._0_16_ = auVar85;
    if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p) {
      values[0]._9_7_ = auVar85._9_7_;
      values[0]._8_1_ = 1;
      values[0].ref.ptr = this_00.ptr;
      MutexSys::lock((MutexSys *)this_00.ptr);
      if ((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p != (__pointer_type)0x0
         ) {
        LOCK();
        paVar3 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesUsed;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xa8) + (long)*(void **)(this_00.ptr + 0x68);
        UNLOCK();
        LOCK();
        paVar3 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesFree;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (((long)*(void **)(this_00.ptr + 0x58) + (long)*(void **)(this_00.ptr + 0x98)) -
             ((long)*(void **)(this_00.ptr + 0x50) + (long)*(void **)(this_00.ptr + 0x90)));
        UNLOCK();
        LOCK();
        paVar3 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesWasted
        ;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xb0) + (long)*(void **)(this_00.ptr + 0x70);
        UNLOCK();
      }
      *(void **)(this_00.ptr + 0x68) = (void *)0x0;
      *(void **)(this_00.ptr + 0x70) = (void *)0x0;
      *(void **)(this_00.ptr + 0x58) = (void *)0x0;
      *(void **)(this_00.ptr + 0x60) = (void *)0x0;
      *(void **)(this_00.ptr + 0x48) = (void *)0x0;
      *(void **)(this_00.ptr + 0x50) = (void *)0x0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        *(void **)(this_00.ptr + 0xa8) = (void *)0x0;
        *(void **)(this_00.ptr + 0xb0) = (void *)0x0;
        *(void **)(this_00.ptr + 0x98) = (void *)0x0;
        *(void **)(this_00.ptr + 0xa0) = (void *)0x0;
        *(void **)(this_00.ptr + 0x88) = (void *)0x0;
        *(void **)(this_00.ptr + 0x90) = (void *)0x0;
      }
      else {
        *(void **)(this_00.ptr + 0x60) = (void *)(alloc.alloc)->defaultBlockSize;
        *(void **)(this_00.ptr + 0x88) = (void *)0x0;
        *(void **)(this_00.ptr + 0x90) = (void *)0x0;
        *(void **)(this_00.ptr + 0x98) = (void *)0x0;
        *(void **)(this_00.ptr + 0xa0) = (void *)0x0;
        *(void **)(this_00.ptr + 0xa8) = (void *)0x0;
        *(void **)(this_00.ptr + 0xb0) = (void *)0x0;
        *(void **)(this_00.ptr + 0xa0) = (void *)(alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p = alloc.alloc;
      UNLOCK();
      vc0.field_0._0_8_ = this_00.ptr;
      children.children.items[0].super_BuildRecord._8_1_ = 1;
      children.children.items[0].super_BuildRecord.depth =
           (size_t)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&vc0);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&children);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)values);
    }
    uVar26 = va1.field_0._0_8_;
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + va1.field_0._0_8_;
    sVar36 = (alloc.talloc1)->cur;
    uVar48 = (ulong)(-(int)sVar36 & 0xf);
    uVar46 = sVar36 + va1.field_0._0_8_ + uVar48;
    (alloc.talloc1)->cur = uVar46;
    if ((alloc.talloc1)->end < uVar46) {
      (alloc.talloc1)->cur = sVar36;
      uVar48 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(va1.field_0._0_8_ * 4) < uVar48 || va1.field_0._0_8_ * 4 - uVar48 == 0) {
        children.children.items[0].super_BuildRecord.depth = uVar48;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
        (alloc.talloc1)->ptr = pcVar41;
        sVar36 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar36;
        (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
        (alloc.talloc1)->cur = uVar26;
        if (children.children.items[0].super_BuildRecord.depth < (ulong)uVar26) {
          (alloc.talloc1)->cur = 0;
          children.children.items[0].super_BuildRecord.depth = (alloc.talloc1)->allocBlockSize;
          pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
          (alloc.talloc1)->ptr = pcVar41;
          sVar36 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar36;
          (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
          (alloc.talloc1)->cur = uVar26;
          if (children.children.items[0].super_BuildRecord.depth < (ulong)uVar26) {
            (alloc.talloc1)->cur = 0;
            pcVar41 = (char *)0x0;
            goto LAB_004c0bea;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar36;
      }
      else {
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&va1);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar48;
      pcVar41 = (alloc.talloc1)->ptr + (uVar46 - va1.field_0._0_8_);
    }
LAB_004c0bea:
    uVar48 = 7;
    if (uVar51 < 7) {
      uVar48 = uVar51;
    }
    local_1b98._8_8_ = 0xff800000ff800000;
    local_1b98._0_8_ = 0xff800000ff800000;
    local_1ba8._8_8_ = 0xff800000ff800000;
    local_1ba8._0_8_ = 0xff800000ff800000;
    aVar57 = _DAT_01f45a30;
    aVar60 = _DAT_01f45a30;
    for (uVar46 = 0; fVar76 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper,
        fVar82 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower,
        uVar38 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end,
        uVar46 != uVar51; uVar46 = uVar46 + 1) {
      pPVar7 = (current.super_BuildRecord.prims.prims)->items;
      pSVar11 = ((this->createLeaf).bvh)->scene;
      vgeomID.field_0.i[0] = 0xffffffff;
      vgeomID.field_0.i[1] = 0xffffffff;
      vgeomID.field_0.i[2] = 0xffffffff;
      vgeomID.field_0.i[3] = 0xffffffff;
      vprimID.field_0.i[0] = 0xffffffff;
      vprimID.field_0.i[1] = 0xffffffff;
      vprimID.field_0.i[2] = 0xffffffff;
      vprimID.field_0.i[3] = 0xffffffff;
      children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
      super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)0x0;
      children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
      super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)0x0;
      children.children.items[0].super_BuildRecord._0_16_ = (undefined1  [16])0x0;
      values[0].lbounds.bounds0.upper.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)0x0;
      values[0].lbounds.bounds0.lower.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)0x0;
      values[0]._0_16_ = (undefined1  [16])0x0;
      vc0.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
      vc0.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
      vc0.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
      va1.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
      va1.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
      va1.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
      vb1.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
      vb1.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
      vb1.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
      vc1.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
      vc1.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
      vc1.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
      uVar49 = 0;
      auVar85 = _DAT_01f45a40;
      aVar89 = _DAT_01f45a30;
      auVar80 = _DAT_01f45a40;
      aVar92 = _DAT_01f45a30;
      while ((uVar49 < 4 && (uVar43 < uVar38))) {
        fVar88 = pPVar7[uVar43].lbounds.bounds0.lower.field_0.m128[3];
        fVar86 = pPVar7[uVar43].lbounds.bounds0.upper.field_0.m128[3];
        pGVar12 = (pSVar11->geometries).items[(uint)fVar88].ptr;
        fVar81 = pGVar12->fnumTimeSegments;
        fVar90 = (pGVar12->time_range).lower;
        fVar61 = (pGVar12->time_range).upper - fVar90;
        fVar55 = (fVar82 - fVar90) / fVar61;
        local_1eb0 = (BuildRecord *)uVar43;
        fVar91 = floorf(fVar55 * 1.0000002 * fVar81);
        fVar87 = 0.0;
        if (0.0 <= fVar91) {
          fVar87 = fVar91;
        }
        local_1e6c = (undefined4)fVar87;
        lVar30 = *(long *)&pGVar12->field_0x58;
        lVar31 = pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 (long)(ulong)(uint)fVar86;
        local_1e80._8_8_ = &lprims;
        local_1ed8 = (fVar76 - fVar90) / fVar61;
        fStack_1ed4 = fVar76;
        fStack_1ed0 = fVar76;
        fStack_1ecc = fVar76;
        local_1ec8._0_4_ = fVar81 * local_1ed8;
        lprims = (PrimRefVector)(ulong)(uint)fVar86;
        local_1e80._0_8_ = pGVar12;
        fVar87 = floorf(fVar81 * fVar55);
        fVar90 = ceilf((float)local_1ec8._0_4_);
        iVar34 = (int)fVar87;
        if (fVar87 <= 0.0) {
          fVar87 = 0.0;
        }
        fVar91 = fVar90;
        if (fVar81 <= fVar90) {
          fVar91 = fVar81;
        }
        local_1ee8._4_4_ = extraout_XMM0_Db;
        local_1ee8._0_4_ = fVar91;
        auStack_1ee0._0_4_ = extraout_XMM0_Dc;
        auStack_1ee0._4_4_ = extraout_XMM0_Dd;
        local_1e68 = (float)iVar34;
        iVar40 = -1;
        if (-1 < iVar34) {
          iVar40 = iVar34;
        }
        iVar34 = (int)fVar81 + 1;
        if ((int)fVar90 < (int)fVar81 + 1) {
          iVar34 = (int)fVar90;
        }
        TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&blower0,(anon_class_16_2_4e716a3c *)&local_1e80,(long)(int)fVar87);
        TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&bupper1,(anon_class_16_2_4e716a3c *)&local_1e80,(long)(int)fVar91);
        fVar90 = fVar81 * fVar55 - fVar87;
        if (iVar34 - iVar40 == 1) {
          if (fVar90 <= 0.0) {
            fVar90 = 0.0;
          }
          fVar81 = 1.0 - fVar90;
          auVar72._0_4_ =
               fVar81 * blower0.lower.field_0.m128[0] + fVar90 * bupper1.lower.field_0.m128[0];
          auVar72._4_4_ =
               fVar81 * blower0.lower.field_0.m128[1] + fVar90 * bupper1.lower.field_0.m128[1];
          auVar72._8_4_ =
               fVar81 * blower0.lower.field_0.m128[2] + fVar90 * bupper1.lower.field_0.m128[2];
          auVar72._12_4_ =
               fVar81 * blower0.lower.field_0.m128[3] + fVar90 * bupper1.lower.field_0.m128[3];
          auVar66._0_4_ =
               fVar81 * blower0.upper.field_0.m128[0] + fVar90 * bupper1.upper.field_0.m128[0];
          auVar66._4_4_ =
               fVar81 * blower0.upper.field_0.m128[1] + fVar90 * bupper1.upper.field_0.m128[1];
          auVar66._8_4_ =
               fVar81 * blower0.upper.field_0.m128[2] + fVar90 * bupper1.upper.field_0.m128[2];
          auVar66._12_4_ =
               fVar81 * blower0.upper.field_0.m128[3] + fVar90 * bupper1.upper.field_0.m128[3];
          fVar81 = (float)local_1ee8._0_4_ - (float)local_1ec8._0_4_;
          if ((float)local_1ee8._0_4_ - (float)local_1ec8._0_4_ <= 0.0) {
            fVar81 = 0.0;
          }
          fVar87 = 1.0 - fVar81;
          auVar79._0_4_ =
               bupper1.lower.field_0.m128[0] * fVar87 + blower0.lower.field_0.m128[0] * fVar81;
          auVar79._4_4_ =
               bupper1.lower.field_0.m128[1] * fVar87 + blower0.lower.field_0.m128[1] * fVar81;
          auVar79._8_4_ =
               bupper1.lower.field_0.m128[2] * fVar87 + blower0.lower.field_0.m128[2] * fVar81;
          auVar79._12_4_ =
               bupper1.lower.field_0.m128[3] * fVar87 + blower0.lower.field_0.m128[3] * fVar81;
          fVar91 = fVar87 * bupper1.upper.field_0.m128[0] + fVar81 * blower0.upper.field_0.m128[0];
          fVar61 = fVar87 * bupper1.upper.field_0.m128[1] + fVar81 * blower0.upper.field_0.m128[1];
          fVar93 = fVar87 * bupper1.upper.field_0.m128[2] + fVar81 * blower0.upper.field_0.m128[2];
          fVar90 = fVar87 * bupper1.upper.field_0.m128[3] + fVar81 * blower0.upper.field_0.m128[3];
          pBVar42 = local_1eb0;
        }
        else {
          TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&blower1,(anon_class_16_2_4e716a3c *)&local_1e80,(long)((int)fVar87 + 1));
          TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&bupper0,(anon_class_16_2_4e716a3c *)&local_1e80,(long)((int)fVar91 + -1));
          pBVar42 = local_1eb0;
          if (fVar90 <= 0.0) {
            fVar90 = 0.0;
          }
          fVar87 = 1.0 - fVar90;
          auVar72._0_4_ =
               blower0.lower.field_0.m128[0] * fVar87 + blower1.lower.field_0.m128[0] * fVar90;
          auVar72._4_4_ =
               blower0.lower.field_0.m128[1] * fVar87 + blower1.lower.field_0.m128[1] * fVar90;
          auVar72._8_4_ =
               blower0.lower.field_0.m128[2] * fVar87 + blower1.lower.field_0.m128[2] * fVar90;
          auVar72._12_4_ =
               blower0.lower.field_0.m128[3] * fVar87 + blower1.lower.field_0.m128[3] * fVar90;
          auVar66._0_4_ =
               fVar87 * blower0.upper.field_0.m128[0] + fVar90 * blower1.upper.field_0.m128[0];
          auVar66._4_4_ =
               fVar87 * blower0.upper.field_0.m128[1] + fVar90 * blower1.upper.field_0.m128[1];
          auVar66._8_4_ =
               fVar87 * blower0.upper.field_0.m128[2] + fVar90 * blower1.upper.field_0.m128[2];
          auVar66._12_4_ =
               fVar87 * blower0.upper.field_0.m128[3] + fVar90 * blower1.upper.field_0.m128[3];
          fVar87 = (float)local_1ee8._0_4_ - (float)local_1ec8._0_4_;
          if (fVar87 <= 0.0) {
            fVar87 = 0.0;
          }
          fVar90 = 1.0 - fVar87;
          auVar79._0_4_ =
               bupper1.lower.field_0.m128[0] * fVar90 + bupper0.lower.field_0.m128[0] * fVar87;
          auVar79._4_4_ =
               bupper1.lower.field_0.m128[1] * fVar90 + bupper0.lower.field_0.m128[1] * fVar87;
          auVar79._8_4_ =
               bupper1.lower.field_0.m128[2] * fVar90 + bupper0.lower.field_0.m128[2] * fVar87;
          auVar79._12_4_ =
               bupper1.lower.field_0.m128[3] * fVar90 + bupper0.lower.field_0.m128[3] * fVar87;
          fVar91 = fVar90 * bupper1.upper.field_0.m128[0] + fVar87 * bupper0.upper.field_0.m128[0];
          fVar61 = fVar90 * bupper1.upper.field_0.m128[1] + fVar87 * bupper0.upper.field_0.m128[1];
          fVar93 = fVar90 * bupper1.upper.field_0.m128[2] + fVar87 * bupper0.upper.field_0.m128[2];
          fVar90 = fVar90 * bupper1.upper.field_0.m128[3] + fVar87 * bupper0.upper.field_0.m128[3];
          fVar87 = local_1e68;
          if ((int)local_1e68 < 0) {
            fVar87 = -NAN;
          }
          local_1ed8 = local_1ed8 - fVar55;
          sVar36 = (size_t)(int)fVar87;
          while (sVar36 = sVar36 + 1, (long)sVar36 < (long)iVar34) {
            fVar87 = ((float)(int)sVar36 / fVar81 - fVar55) / local_1ed8;
            fVar58 = 1.0 - fVar87;
            fVar73 = auVar72._4_4_;
            fVar74 = auVar72._8_4_;
            fVar75 = auVar72._12_4_;
            auStack_1e60._0_4_ = fVar74 * fVar58 + auVar79._8_4_ * fVar87;
            auStack_1e60._4_4_ = fVar75 * fVar58 + auVar79._12_4_ * fVar87;
            fStack_1e64 = fVar73 * fVar58 + auVar79._4_4_ * fVar87;
            local_1e68 = auVar72._0_4_ * fVar58 + auVar79._0_4_ * fVar87;
            fVar67 = auVar66._4_4_;
            fVar68 = auVar66._8_4_;
            fVar69 = auVar66._12_4_;
            local_1ee8._4_4_ = fVar61;
            local_1ee8._0_4_ = fVar91;
            auStack_1ee0._0_4_ = fVar93;
            auStack_1ee0._4_4_ = fVar90;
            _local_1ec8 = auVar79;
            TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                      (&bi,(anon_class_16_2_4e716a3c *)&local_1e80,sVar36);
            auVar54._0_4_ = bi.lower.field_0.m128[0] - local_1e68;
            auVar54._4_4_ = bi.lower.field_0.m128[1] - fStack_1e64;
            auVar54._8_4_ = bi.lower.field_0.m128[2] - (float)auStack_1e60._0_4_;
            auVar54._12_4_ = bi.lower.field_0.m128[3] - (float)auStack_1e60._4_4_;
            auVar56._0_4_ = bi.upper.field_0.m128[0] - (fVar58 * auVar66._0_4_ + fVar87 * fVar91);
            auVar56._4_4_ = bi.upper.field_0.m128[1] - (fVar58 * fVar67 + fVar87 * fVar61);
            auVar56._8_4_ = bi.upper.field_0.m128[2] - (fVar58 * fVar68 + fVar87 * fVar93);
            auVar56._12_4_ = bi.upper.field_0.m128[3] - (fVar58 * fVar69 + fVar87 * fVar90);
            auVar65 = minps(auVar54,ZEXT816(0));
            auVar71 = maxps(auVar56,ZEXT816(0));
            auVar72._0_4_ = auVar72._0_4_ + auVar65._0_4_;
            auVar72._4_4_ = fVar73 + auVar65._4_4_;
            auVar72._8_4_ = fVar74 + auVar65._8_4_;
            auVar72._12_4_ = fVar75 + auVar65._12_4_;
            auVar79._0_4_ = (float)local_1ec8._0_4_ + auVar65._0_4_;
            auVar79._4_4_ = (float)local_1ec8._4_4_ + auVar65._4_4_;
            auVar79._8_4_ = (float)uStack_1ec0 + auVar65._8_4_;
            auVar79._12_4_ = uStack_1ec0._4_4_ + auVar65._12_4_;
            auVar66._0_4_ = auVar66._0_4_ + auVar71._0_4_;
            auVar66._4_4_ = fVar67 + auVar71._4_4_;
            auVar66._8_4_ = fVar68 + auVar71._8_4_;
            auVar66._12_4_ = fVar69 + auVar71._12_4_;
            fVar91 = (float)local_1ee8._0_4_ + auVar71._0_4_;
            fVar61 = (float)local_1ee8._4_4_ + auVar71._4_4_;
            fVar93 = (float)auStack_1ee0._0_4_ + auVar71._8_4_;
            fVar90 = (float)auStack_1ee0._4_4_ + auVar71._12_4_;
          }
        }
        lVar13 = *(long *)&pGVar12[2].numPrimitives;
        lVar14 = *(long *)(lVar13 + (long)(int)local_1e6c * 0x38);
        lVar15 = *(long *)(lVar13 + 0x10 + (long)(int)local_1e6c * 0x38);
        pfVar37 = (float *)(lVar14 + lVar15 * (ulong)*(uint *)(lVar30 + lVar31));
        fVar87 = *pfVar37;
        fVar55 = pfVar37[1];
        fVar58 = pfVar37[2];
        lVar47 = (long)(local_1e6c + 1) * 0x38;
        lVar16 = *(long *)(lVar13 + lVar47);
        lVar13 = *(long *)(lVar13 + 0x10 + lVar47);
        uVar45 = (ulong)*(uint *)(lVar30 + 4 + lVar31);
        pfVar37 = (float *)(lVar16 + (ulong)*(uint *)(lVar30 + lVar31) * lVar13);
        fVar67 = *pfVar37;
        fVar68 = pfVar37[1];
        fVar69 = pfVar37[2];
        pfVar37 = (float *)(lVar14 + lVar15 * uVar45);
        fVar73 = *pfVar37;
        fVar74 = pfVar37[1];
        fVar75 = pfVar37[2];
        pfVar37 = (float *)(lVar16 + uVar45 * lVar13);
        fVar18 = *pfVar37;
        fVar19 = pfVar37[1];
        fVar20 = pfVar37[2];
        uVar45 = (ulong)*(uint *)(lVar30 + 8 + lVar31);
        aVar92.m128 = (__m128)minps(aVar92.m128,auVar72);
        auVar80 = maxps(auVar80,auVar66);
        aVar89.m128 = (__m128)minps(aVar89.m128,auVar79);
        fVar81 = (pGVar12->time_range).lower;
        auVar17._4_4_ = fVar61;
        auVar17._0_4_ = fVar91;
        auVar17._8_4_ = fVar93;
        auVar17._12_4_ = fVar90;
        auVar85 = maxps(auVar85,auVar17);
        fVar91 = (pGVar12->time_range).upper - fVar81;
        fVar90 = ((float)(int)local_1e6c * fVar91) / pGVar12->fnumTimeSegments + fVar81;
        fVar62 = 1.0 / ((((float)(local_1e6c + 1) * fVar91) / pGVar12->fnumTimeSegments + fVar81) -
                       fVar90);
        fVar64 = -fVar90 * fVar62;
        fVar59 = 1.0 - fVar64;
        fVar62 = (1.0 - fVar90) * fVar62;
        fVar63 = 1.0 - fVar62;
        pfVar37 = (float *)(lVar14 + lVar15 * uVar45);
        fVar81 = *pfVar37;
        fVar90 = pfVar37[1];
        fVar91 = pfVar37[2];
        pfVar37 = (float *)(lVar16 + lVar13 * uVar45);
        fVar61 = *pfVar37;
        fVar93 = pfVar37[1];
        fVar21 = pfVar37[2];
        *(float *)((long)&children.children.items[0].super_BuildRecord.depth + uVar49 * 4) =
             fVar87 * fVar59 + fVar67 * fVar64;
        *(float *)((long)&children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                          super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                          field_0 + uVar49 * 4) = fVar55 * fVar59 + fVar68 * fVar64;
        *(float *)((long)&children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                          super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                          field_0 + uVar49 * 4) = fVar58 * fVar59 + fVar69 * fVar64;
        *(float *)((long)&va1.field_0 + uVar49 * 4) = fVar87 * fVar63 + fVar67 * fVar62;
        *(float *)((long)&va1.field_0 + uVar49 * 4 + 0x10) = fVar55 * fVar63 + fVar68 * fVar62;
        *(float *)((long)&va1.field_0 + uVar49 * 4 + 0x20) = fVar58 * fVar63 + fVar69 * fVar62;
        *(float *)((long)&values[0].ref.ptr + uVar49 * 4) = fVar73 * fVar59 + fVar18 * fVar64;
        *(float *)((long)&values[0].lbounds.bounds0.lower.field_0 + uVar49 * 4) =
             fVar74 * fVar59 + fVar19 * fVar64;
        *(float *)((long)&values[0].lbounds.bounds0.upper.field_0 + uVar49 * 4) =
             fVar75 * fVar59 + fVar20 * fVar64;
        *(float *)((long)&vb1.field_0 + uVar49 * 4) = fVar73 * fVar63 + fVar18 * fVar62;
        *(float *)((long)&vb1.field_0 + uVar49 * 4 + 0x10) = fVar74 * fVar63 + fVar19 * fVar62;
        *(float *)((long)&vb1.field_0 + uVar49 * 4 + 0x20) = fVar75 * fVar63 + fVar20 * fVar62;
        *(float *)((long)&vc0.field_0 + uVar49 * 4) = fVar59 * fVar81 + fVar64 * fVar61;
        *(float *)((long)&vc0.field_0 + uVar49 * 4 + 0x10) = fVar59 * fVar90 + fVar64 * fVar93;
        *(float *)((long)&vc0.field_0 + uVar49 * 4 + 0x20) = fVar59 * fVar91 + fVar64 * fVar21;
        *(float *)((long)&vc1.field_0 + uVar49 * 4) = fVar63 * fVar81 + fVar62 * fVar61;
        *(float *)((long)&vc1.field_0 + uVar49 * 4 + 0x10) = fVar63 * fVar90 + fVar62 * fVar93;
        *(float *)((long)&vc1.field_0 + uVar49 * 4 + 0x20) = fVar63 * fVar91 + fVar62 * fVar21;
        *(float *)((long)&vgeomID.field_0 + uVar49 * 4) = fVar88;
        *(float *)((long)&vprimID.field_0 + uVar49 * 4) = fVar86;
        uVar49 = uVar49 + 1;
        uVar43 = (long)pBVar42 + 1;
      }
      lVar30 = uVar46 * 0x140;
      *(size_t *)(pcVar41 + lVar30) = children.children.items[0].super_BuildRecord.depth;
      *(undefined8 *)((long)(pcVar41 + lVar30) + 8) =
           children.children.items[0].super_BuildRecord._8_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x10) =
           children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x10 + 8) =
           children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x20) =
           children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x20 + 8) =
           children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_;
      *(size_t *)(pcVar41 + lVar30 + 0x30) = values[0].ref.ptr;
      *(undefined8 *)((long)(pcVar41 + lVar30 + 0x30) + 8) = values[0]._8_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x40) = values[0].lbounds.bounds0.lower.field_0._0_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x40 + 8) = values[0].lbounds.bounds0.lower.field_0._8_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x50) = values[0].lbounds.bounds0.upper.field_0._0_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x50 + 8) = values[0].lbounds.bounds0.upper.field_0._8_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x60) = vc0.field_0._0_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x60 + 8) = vc0.field_0._8_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x70) = vc0.field_0._16_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x70 + 8) = vc0.field_0._24_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x80) = vc0.field_0._32_8_;
      *(undefined8 *)(pcVar41 + lVar30 + 0x80 + 8) = vc0.field_0._40_8_;
      pfVar37 = (float *)(pcVar41 + lVar30 + 0x90);
      *pfVar37 = (float)va1.field_0._0_4_ -
                 (float)children.children.items[0].super_BuildRecord.depth;
      pfVar37[1] = (float)va1.field_0._4_4_ -
                   children.children.items[0].super_BuildRecord.depth._4_4_;
      pfVar37[2] = (float)va1.field_0._8_4_ -
                   (float)children.children.items[0].super_BuildRecord._8_4_;
      pfVar37[3] = (float)va1.field_0._12_4_ -
                   (float)children.children.items[0].super_BuildRecord._12_4_;
      pfVar37 = (float *)(pcVar41 + lVar30 + 0xa0);
      *pfVar37 = (float)va1.field_0._16_4_ -
                 children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                 super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
                 m128[0];
      pfVar37[1] = (float)va1.field_0._20_4_ -
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
                   m128[1];
      pfVar37[2] = (float)va1.field_0._24_4_ -
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
                   m128[2];
      pfVar37[3] = (float)va1.field_0._28_4_ -
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
                   m128[3];
      pfVar37 = (float *)(pcVar41 + lVar30 + 0xb0);
      *pfVar37 = (float)va1.field_0._32_4_ -
                 children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                 super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
                 m128[0];
      pfVar37[1] = (float)va1.field_0._36_4_ -
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
                   m128[1];
      pfVar37[2] = (float)va1.field_0._40_4_ -
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
                   m128[2];
      pfVar37[3] = (float)va1.field_0._44_4_ -
                   children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                   super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
                   m128[3];
      pfVar37 = (float *)(pcVar41 + lVar30 + 0xc0);
      *pfVar37 = (float)vb1.field_0._0_4_ - (float)values[0].ref.ptr;
      pfVar37[1] = (float)vb1.field_0._4_4_ - values[0].ref.ptr._4_4_;
      pfVar37[2] = (float)vb1.field_0._8_4_ - (float)values[0]._8_4_;
      pfVar37[3] = (float)vb1.field_0._12_4_ - (float)values[0]._12_4_;
      pfVar37 = (float *)(pcVar41 + lVar30 + 0xd0);
      *pfVar37 = (float)vb1.field_0._16_4_ - (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
      pfVar37[1] = (float)vb1.field_0._20_4_ - (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
      pfVar37[2] = (float)vb1.field_0._24_4_ - (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
      pfVar37[3] = (float)vb1.field_0._28_4_ - (float)values[0].lbounds.bounds0.lower.field_0._12_4_
      ;
      pfVar37 = (float *)(pcVar41 + lVar30 + 0xe0);
      *pfVar37 = (float)vb1.field_0._32_4_ - (float)values[0].lbounds.bounds0.upper.field_0._0_4_;
      pfVar37[1] = (float)vb1.field_0._36_4_ - (float)values[0].lbounds.bounds0.upper.field_0._4_4_;
      pfVar37[2] = (float)vb1.field_0._40_4_ - (float)values[0].lbounds.bounds0.upper.field_0._8_4_;
      pfVar37[3] = (float)vb1.field_0._44_4_ - (float)values[0].lbounds.bounds0.upper.field_0._12_4_
      ;
      pfVar37 = (float *)(pcVar41 + lVar30 + 0xf0);
      *pfVar37 = (float)vc1.field_0._0_4_ - (float)vc0.field_0._0_4_;
      pfVar37[1] = (float)vc1.field_0._4_4_ - (float)vc0.field_0._4_4_;
      pfVar37[2] = (float)vc1.field_0._8_4_ - (float)vc0.field_0._8_4_;
      pfVar37[3] = (float)vc1.field_0._12_4_ - (float)vc0.field_0._12_4_;
      pfVar37 = (float *)(pcVar41 + lVar30 + 0x100);
      *pfVar37 = (float)vc1.field_0._16_4_ - (float)vc0.field_0._16_4_;
      pfVar37[1] = (float)vc1.field_0._20_4_ - (float)vc0.field_0._20_4_;
      pfVar37[2] = (float)vc1.field_0._24_4_ - (float)vc0.field_0._24_4_;
      pfVar37[3] = (float)vc1.field_0._28_4_ - (float)vc0.field_0._28_4_;
      pfVar37 = (float *)(pcVar41 + lVar30 + 0x110);
      *pfVar37 = (float)vc1.field_0._32_4_ - (float)vc0.field_0._32_4_;
      pfVar37[1] = (float)vc1.field_0._36_4_ - (float)vc0.field_0._36_4_;
      pfVar37[2] = (float)vc1.field_0._40_4_ - (float)vc0.field_0._40_4_;
      pfVar37[3] = (float)vc1.field_0._44_4_ - (float)vc0.field_0._44_4_;
      *(ulong *)(pcVar41 + lVar30 + 0x120) = CONCAT44(vgeomID.field_0.i[1],vgeomID.field_0.i[0]);
      *(ulong *)(pcVar41 + lVar30 + 0x120 + 8) = CONCAT44(vgeomID.field_0.i[3],vgeomID.field_0.i[2])
      ;
      *(ulong *)(pcVar41 + lVar30 + 0x130) = CONCAT44(vprimID.field_0.i[1],vprimID.field_0.i[0]);
      *(ulong *)(pcVar41 + lVar30 + 0x130 + 8) = CONCAT44(vprimID.field_0.i[3],vprimID.field_0.i[2])
      ;
      aVar60.m128 = (__m128)minps(aVar60.m128,aVar92.m128);
      local_1b98 = maxps(local_1b98,auVar80);
      aVar57.m128 = (__m128)minps(aVar57.m128,aVar89.m128);
      local_1ba8 = maxps(local_1ba8,auVar85);
    }
    (local_1eb8->ref).ptr = uVar48 | (ulong)pcVar41 | 8;
    (local_1eb8->lbounds).bounds0.lower.field_0 = aVar60;
    *(undefined8 *)&(local_1eb8->lbounds).bounds0.upper.field_0 = local_1b98._0_8_;
    *(undefined8 *)((long)&(local_1eb8->lbounds).bounds0.upper.field_0 + 8) = local_1b98._8_8_;
    (local_1eb8->lbounds).bounds1.lower.field_0 = aVar57;
    *(undefined8 *)&(local_1eb8->lbounds).bounds1.upper.field_0 = local_1ba8._0_8_;
    *(undefined8 *)((long)&(local_1eb8->lbounds).bounds1.upper.field_0 + 8) = local_1ba8._8_8_;
    BVar22.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    BVar22.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
    local_1eb8->dt = BVar22;
    return local_1eb8;
  }
  local_1eb0 = in;
  _local_1e68 = &children;
  array_t<embree::sse2::BVHBuilderMSMBlur::BuildRecordSplit,_16UL>::array_t(&children.children);
  children.numChildren = 1;
  _local_1ed8 = 1;
  children.numSharedPrimVecs = 1;
  BuildRecordSplit::operator=((BuildRecordSplit *)&children,&current);
  children.sharedPrimVecs.items[0].prims = current.super_BuildRecord.prims.prims;
  children.sharedPrimVecs.items[0].refCount = 2;
  children.primvecs.items[0] = children.sharedPrimVecs.items;
  pHVar1 = &this->heuristicTemporalSplit;
  uVar51 = 0;
  local_1f08._8_8_ = 0x7f8000007f800000;
  local_1f08._0_8_ = 0x7f8000007f800000;
  uStack_1ec0 = 0xff800000ff800000;
  local_1ec8 = (undefined1  [8])0xff800000ff800000;
  do {
    prVar39 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.object_range;
    uVar48 = 0;
    sVar36 = 0xffffffffffffffff;
    for (sVar44 = 0; children.numChildren != sVar44; sVar44 = sVar44 + 1) {
      uVar46 = prVar39->_end - prVar39->_begin;
      if ((((this->cfg).maxLeafSize < uVar46) || (1 < *(uint *)((long)(prVar39 + 4) + 0xc))) ||
         (bVar52)) {
        if (uVar48 < uVar46) {
          sVar36 = sVar44;
          uVar48 = uVar46;
        }
        bVar52 = false;
      }
      prVar39 = prVar39 + 0xf;
    }
    if (sVar36 == 0xffffffffffffffff) break;
    local_1ee8 = (undefined1  [8])uVar51;
    pBVar42 = &children.children.items[sVar36].super_BuildRecord;
    vc0.field_0._0_8_ = current.super_BuildRecord.depth + 1;
    va1.field_0._0_8_ = current.super_BuildRecord.depth + 1;
    uVar5 = children.children.items[sVar36].split.data;
    if (3 < uVar5) goto LAB_004bfa64;
    this_01 = &children.children.items[sVar36].super_BuildRecord.prims;
    switch(uVar5) {
    case 0:
      vb1.field_0._8_8_ = 0x7f8000007f800000;
      vb1.field_0._0_8_ = 0x7f8000007f800000;
      vb1.field_0._24_8_ = 0xff800000ff800000;
      vb1.field_0._16_8_ = 0xff800000ff800000;
      vb1.field_0._40_8_ = 0x7f8000007f800000;
      vb1.field_0._32_8_ = 0x7f8000007f800000;
      local_1e28[0]._0_8_ = 0xff800000ff800000;
      local_1e28[0]._8_8_ = 0xff800000ff800000;
      blower0.lower.field_0._0_8_ = &children.children.items[sVar36].split;
      vc1.field_0._8_8_ = 0x7f8000007f800000;
      vc1.field_0._0_8_ = 0x7f8000007f800000;
      vc1.field_0._24_8_ = 0xff800000ff800000;
      vc1.field_0._16_8_ = 0xff800000ff800000;
      vc1.field_0._40_8_ = 0x7f8000007f800000;
      vc1.field_0._32_8_ = 0x7f8000007f800000;
      local_1cc8 = 0;
      uStack_1cc0 = 0;
      bupper1.lower.field_0.m128[1] = (float)children.children.items[sVar36].split.field_2.pos;
      bupper1.lower.field_0.m128[0] = bupper1.lower.field_0.m128[1];
      bupper1.lower.field_0.m128[3] = bupper1.lower.field_0.m128[1];
      bupper1.lower.field_0.m128[2] = bupper1.lower.field_0.m128[1];
      lVar30 = (long)(1 << ((byte)children.children.items[sVar36].split.dim & 0x1f)) * 0x10;
      blower1.lower.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar30);
      blower1.lower.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar30 + 8);
      blower0.lower.field_0._8_8_ = &bupper1;
      blower0.upper.field_0._0_8_ = &blower1;
      parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                ((children.children.items[sVar36].super_BuildRecord.prims.prims)->items,
                 children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.
                 object_range._begin,
                 children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.
                 object_range._end,(EmptyTy *)&local_1e80,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vb1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vc1,
                 (anon_class_24_3_c5d13451 *)&blower0,(anon_class_1_0_00000001 *)&bupper0,
                 (anon_class_1_0_00000001 *)&bi,0x80,0xc00);
      local_1bf8 = children.children.items[sVar36].super_BuildRecord.prims.prims;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vc0.field_0.field_0.y,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vb1);
      local_1978 = children.children.items[sVar36].super_BuildRecord.prims.prims;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&va1.field_0.field_0.y,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vc1);
      break;
    case 1:
      SetMB::deterministic_order(this_01);
      splitFallback(this,this_01,(SetMB *)&vc0.field_0.field_0.y,(SetMB *)&va1.field_0.field_0.y);
      break;
    case 2:
      vprimID.field_0.i[0] = (uint)children.children.items[sVar36].split.field_2;
      vgeomID.field_0.i[0] =
           (uint)children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.time_range
                 .lower;
      vprimID.field_0.i[1] =
           (uint)children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.time_range
                 .upper;
      pmVar9 = children.children.items[sVar36].super_BuildRecord.prims.prims;
      vgeomID.field_0.i[1] = vprimID.field_0.i[0];
      _Var28.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )::operator_new(0x28);
      pMVar8 = pHVar1->device;
      *(long *)((long)_Var28.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x20) = 0;
      uVar43 = children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      uVar38 = children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      *(MemoryMonitorInterface **)
       _Var28.
       super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       .
       super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
       ._M_head_impl = pMVar8;
      *(undefined1 *)
       ((long)_Var28.
              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 8) = 0;
      *(long *)((long)_Var28.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x10) = 0;
      *(long *)((long)_Var28.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x18) = 0;
      lVar30 = uVar43 - uVar38;
      uVar38 = uVar43;
      if (lVar30 != 0) {
        uVar51 = lVar30 * 0x50;
        (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,uVar51,0);
        if (uVar51 < 0x1c00000) {
          pvVar29 = alignedMalloc(uVar51,0x10);
        }
        else {
          pvVar29 = os_malloc(uVar51,(bool *)((long)_Var28.
                                                  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                  ._M_head_impl + 8));
        }
        *(void **)((long)_Var28.
                         super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         .
                         super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                         ._M_head_impl + 0x20) = pvVar29;
        *(long *)((long)_Var28.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x10) = lVar30;
        *(long *)((long)_Var28.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x18) = lVar30;
        uVar43 = children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.
                 object_range._begin;
        uVar38 = children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.
                 object_range._end;
      }
      blower1.lower.field_0._8_8_ = &vgeomID;
      blower1.upper.field_0._8_8_ = &lprims;
      vb1.field_0._8_8_ = 0x7f8000007f800000;
      vb1.field_0._0_8_ = 0x7f8000007f800000;
      vb1.field_0._24_8_ = 0xff800000ff800000;
      vb1.field_0._16_8_ = 0xff800000ff800000;
      vb1.field_0._40_8_ = 0x7f8000007f800000;
      vb1.field_0._32_8_ = 0x7f8000007f800000;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )_Var28.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      lprims = (PrimRefVector)
               _Var28.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      blower1.lower.field_0._0_8_ = pmVar9;
      blower1.upper.field_0._0_8_ = pHVar1;
      if (uVar38 - uVar43 < 0xc00) {
        blower0.lower.field_0._0_8_ = uVar43;
        blower0.lower.field_0._8_8_ = uVar38;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)&vc1,(anon_class_40_5_808acc65 *)&blower1,
                   (range<unsigned_long> *)&blower0);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&blower0,(context_traits)0x4,CUSTOM_CTX);
        bupper1.upper.field_0._0_8_ = 0x80;
        bupper0.lower.field_0._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        bupper0.lower.field_0._8_8_ = &blower1;
        bupper1.lower.field_0._0_8_ = uVar38;
        bupper1.lower.field_0._8_8_ = uVar43;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vc1,(d1 *)&bupper1,
                   (blocked_range<unsigned_long> *)&vb1,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bupper0,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&blower0,(task_group_context *)pBVar42);
        cVar27 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&blower0);
        if (cVar27 != '\0') {
          prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar33,"task cancelled");
          __cxa_throw(prVar33,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&blower0);
      }
      uVar43 = children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end - children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.
                       object_range._begin;
      if (uStack_1cc0 - local_1cc8 != uVar43) {
        vb1.field_0._0_8_ = &vgeomID;
        uStack_1cc0 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                (lprims->items,0,uVar43,0x400,(anon_class_8_1_41ce32a5 *)&vb1);
      }
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vb1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vc1);
      SetMB::operator=((SetMB *)&vc0.field_0.field_0.y,(SetMB *)&vb1);
      bi.lower.field_0._8_8_ = &vprimID;
      uVar43 = children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      vb1.field_0._8_8_ = 0x7f8000007f800000;
      vb1.field_0._0_8_ = 0x7f8000007f800000;
      vb1.field_0._24_8_ = 0xff800000ff800000;
      vb1.field_0._16_8_ = 0xff800000ff800000;
      vb1.field_0._40_8_ = 0x7f8000007f800000;
      vb1.field_0._32_8_ = 0x7f8000007f800000;
      local_1e28[0]._0_8_ = 0xff800000ff800000;
      local_1e28[0]._8_8_ = 0xff800000ff800000;
      uVar38 = children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      bi.lower.field_0._0_8_ = pmVar9;
      bi.upper.field_0._0_8_ = pHVar1;
      if (uVar38 - uVar43 < 0xc00) {
        bupper1.lower.field_0._0_8_ = uVar43;
        bupper1.lower.field_0._8_8_ = uVar38;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&blower0,(anon_class_24_3_35f68c7c *)&bi,
                   (range<unsigned_long> *)&bupper1);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&bupper1,(context_traits)0x4,CUSTOM_CTX);
        bupper0.upper.field_0._0_8_ = 0x80;
        local_1e80._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1e80._8_8_ = &bi;
        bupper0.lower.field_0._0_8_ = uVar38;
        bupper0.lower.field_0._8_8_ = uVar43;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&blower0,(d1 *)&bupper0,
                   (blocked_range<unsigned_long> *)&vb1,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1e80,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&bupper1,(task_group_context *)pBVar42);
        cVar27 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&bupper1);
        if (cVar27 != '\0') {
          prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar33,"task cancelled");
          __cxa_throw(prVar33,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&bupper1);
      }
      lVar30 = local_1ac0 - local_1ac8;
      local_1ac8 = children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.
                   object_range._begin;
      local_1ac0 = lVar30 + local_1ac8;
      uVar43 = children.children.items[sVar36].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      if (lVar30 != uVar43 - local_1ac8) {
        vb1.field_0._0_8_ = &vprimID;
        local_1ac0 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (pmVar9->items,local_1ac8,uVar43,0x400,
                                (anon_class_8_1_41ce32a6 *)&vb1);
      }
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vb1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&blower0);
      SetMB::operator=((SetMB *)&va1.field_0.field_0.y,(SetMB *)&vb1);
      bVar53 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      goto LAB_004bfa74;
    case 3:
      SetMB::deterministic_order(this_01);
      splitByGeometry(this,this_01,(SetMB *)&vc0.field_0.field_0.y,(SetMB *)&va1.field_0.field_0.y);
    }
LAB_004bfa64:
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    bVar53 = false;
LAB_004bfa74:
    findFallback((Split *)&vb1,this,(SetMB *)&vc0.field_0.field_0.y);
    findFallback((Split *)&vb1,this,(SetMB *)&va1.field_0.field_0.y);
    sVar44 = children.numSharedPrimVecs;
    local_1e88._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    pSVar6 = children.primvecs.items[sVar36];
    if (local_1bf8 == pSVar6->prims) {
      pSVar6->refCount = pSVar6->refCount + 1;
      pvVar35 = local_1bf8;
    }
    else {
      pSVar24 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar25 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar25->prims = local_1bf8;
      children.sharedPrimVecs.items[sVar44].refCount = 1;
      children.primvecs.items[sVar36] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar24->prims;
      pvVar35 = pSVar6->prims;
    }
    sVar36 = children.numSharedPrimVecs;
    if (local_1978 == pvVar35) {
      children.primvecs.items[children.numChildren] = pSVar6;
      sVar36 = pSVar6->refCount;
      pSVar6->refCount = sVar36 + 1;
    }
    else {
      pSVar24 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar25 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar25->prims = local_1978;
      children.sharedPrimVecs.items[sVar36].refCount = 1;
      children.primvecs.items[children.numChildren] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar24->prims;
      sVar36 = pSVar6->refCount - 1;
    }
    pSVar6->refCount = sVar36;
    if (sVar36 == 0) {
      pvVar35 = pSVar6->prims;
      if (pvVar35 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar36 = pvVar35->size_alloced;
        pPVar7 = pvVar35->items;
        if (pPVar7 != (PrimRefMB *)0x0) {
          if (sVar36 * 0x50 < 0x1c00000) {
            alignedFree(pPVar7);
          }
          else {
            os_free(pPVar7,sVar36 * 0x50,(pvVar35->alloc).hugepages);
          }
        }
        if (sVar36 != 0) {
          pMVar8 = (pvVar35->alloc).device;
          (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar36 * -0x50,1);
        }
        pvVar35->size_active = 0;
        pvVar35->size_alloced = 0;
        pvVar35->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar35);
    }
    local_1e88._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecordSplit::operator=((BuildRecordSplit *)pBVar42,(BuildRecordSplit *)&vc0);
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[children.numChildren].super_BuildRecord,
               (BuildRecordSplit *)&va1);
    uVar51 = CONCAT71(local_1ee8._1_7_,local_1ee8[0] | bVar53);
    children.numChildren = children.numChildren + 1;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1e88);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr(&new_vector);
  } while (children.numChildren < (this->cfg).branchingFactor);
  pfVar37 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  sVar36 = children.numChildren;
  while( true ) {
    bVar52 = sVar36 == 0;
    sVar36 = sVar36 - 1;
    if (bVar52) break;
    uVar51 = (ulong)(byte)((byte)uVar51 |
                          -(*pfVar37 < (local_1eb0->prims).super_PrimInfoMB.time_range.upper ||
                           (local_1eb0->prims).super_PrimInfoMB.time_range.lower <
                           ((BBox1f *)(pfVar37 + -1))->lower));
    pfVar37 = pfVar37 + 0x3c;
  }
  if ((uVar51 & 1) == 0) {
    vc1.field_0._0_8_ = 0xe0;
    pTVar10 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
      va1.field_0._8_1_ = 1;
      va1.field_0._0_8_ = pTVar10;
      MutexSys::lock(&pTVar10->mutex);
      if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar3 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar3 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
             ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar3 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar10->alloc0).bytesUsed = 0;
      (pTVar10->alloc0).bytesWasted = 0;
      (pTVar10->alloc0).end = 0;
      (pTVar10->alloc0).allocBlockSize = 0;
      (pTVar10->alloc0).ptr = (char *)0x0;
      (pTVar10->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
      }
      else {
        (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar10->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      vb1.field_0._0_8_ = pTVar10;
      vc0.field_0._8_1_ = 1;
      vc0.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&vb1);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&vc0);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&va1);
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + vc1.field_0._0_8_;
    sVar36 = (alloc.talloc0)->cur;
    uVar48 = (ulong)(-(int)sVar36 & 0xf);
    uVar46 = sVar36 + vc1.field_0._0_8_ + uVar48;
    (alloc.talloc0)->cur = uVar46;
    if ((alloc.talloc0)->end < uVar46) {
      (alloc.talloc0)->cur = sVar36;
      if ((alloc.talloc0)->allocBlockSize < (ulong)(vc1.field_0._0_8_ << 2)) {
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc1);
      }
      else {
        vc0.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc0);
        (alloc.talloc0)->ptr = pcVar41;
        sVar36 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar36;
        (alloc.talloc0)->end = vc0.field_0._0_8_;
        (alloc.talloc0)->cur = vc1.field_0._0_8_;
        if ((ulong)vc0.field_0._0_8_ < (ulong)vc1.field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          vc0.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc0);
          (alloc.talloc0)->ptr = pcVar41;
          sVar36 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar36;
          (alloc.talloc0)->end = vc0.field_0._0_8_;
          (alloc.talloc0)->cur = vc1.field_0._0_8_;
          if ((ulong)vc0.field_0._0_8_ < (ulong)vc1.field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar41 = (char *)0x0;
            goto LAB_004c07c8;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar36;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar48;
      pcVar41 = (alloc.talloc0)->ptr + (uVar46 - vc1.field_0._0_8_);
    }
LAB_004c07c8:
    pcVar41[0x60] = '\0';
    pcVar41[0x61] = '\0';
    pcVar41[0x62] = -0x80;
    pcVar41[99] = '\x7f';
    pcVar41[100] = '\0';
    pcVar41[0x65] = '\0';
    pcVar41[0x66] = -0x80;
    pcVar41[0x67] = '\x7f';
    pcVar41[0x68] = '\0';
    pcVar41[0x69] = '\0';
    pcVar41[0x6a] = -0x80;
    pcVar41[0x6b] = '\x7f';
    pcVar41[0x6c] = '\0';
    pcVar41[0x6d] = '\0';
    pcVar41[0x6e] = -0x80;
    pcVar41[0x6f] = '\x7f';
    pcVar41[0x40] = '\0';
    pcVar41[0x41] = '\0';
    pcVar41[0x42] = -0x80;
    pcVar41[0x43] = '\x7f';
    pcVar41[0x44] = '\0';
    pcVar41[0x45] = '\0';
    pcVar41[0x46] = -0x80;
    pcVar41[0x47] = '\x7f';
    pcVar41[0x48] = '\0';
    pcVar41[0x49] = '\0';
    pcVar41[0x4a] = -0x80;
    pcVar41[0x4b] = '\x7f';
    pcVar41[0x4c] = '\0';
    pcVar41[0x4d] = '\0';
    pcVar41[0x4e] = -0x80;
    pcVar41[0x4f] = '\x7f';
    pcVar41[0x20] = '\0';
    pcVar41[0x21] = '\0';
    pcVar41[0x22] = -0x80;
    pcVar41[0x23] = '\x7f';
    pcVar41[0x24] = '\0';
    pcVar41[0x25] = '\0';
    pcVar41[0x26] = -0x80;
    pcVar41[0x27] = '\x7f';
    pcVar41[0x28] = '\0';
    pcVar41[0x29] = '\0';
    pcVar41[0x2a] = -0x80;
    pcVar41[0x2b] = '\x7f';
    pcVar41[0x2c] = '\0';
    pcVar41[0x2d] = '\0';
    pcVar41[0x2e] = -0x80;
    pcVar41[0x2f] = '\x7f';
    pcVar41[0x70] = '\0';
    pcVar41[0x71] = '\0';
    pcVar41[0x72] = -0x80;
    pcVar41[0x73] = -1;
    pcVar41[0x74] = '\0';
    pcVar41[0x75] = '\0';
    pcVar41[0x76] = -0x80;
    pcVar41[0x77] = -1;
    pcVar41[0x78] = '\0';
    pcVar41[0x79] = '\0';
    pcVar41[0x7a] = -0x80;
    pcVar41[0x7b] = -1;
    pcVar41[0x7c] = '\0';
    pcVar41[0x7d] = '\0';
    pcVar41[0x7e] = -0x80;
    pcVar41[0x7f] = -1;
    pcVar41[0x50] = '\0';
    pcVar41[0x51] = '\0';
    pcVar41[0x52] = -0x80;
    pcVar41[0x53] = -1;
    pcVar41[0x54] = '\0';
    pcVar41[0x55] = '\0';
    pcVar41[0x56] = -0x80;
    pcVar41[0x57] = -1;
    pcVar41[0x58] = '\0';
    pcVar41[0x59] = '\0';
    pcVar41[0x5a] = -0x80;
    pcVar41[0x5b] = -1;
    pcVar41[0x5c] = '\0';
    pcVar41[0x5d] = '\0';
    pcVar41[0x5e] = -0x80;
    pcVar41[0x5f] = -1;
    pcVar41[0x30] = '\0';
    pcVar41[0x31] = '\0';
    pcVar41[0x32] = -0x80;
    pcVar41[0x33] = -1;
    pcVar41[0x34] = '\0';
    pcVar41[0x35] = '\0';
    pcVar41[0x36] = -0x80;
    pcVar41[0x37] = -1;
    pcVar41[0x38] = '\0';
    pcVar41[0x39] = '\0';
    pcVar41[0x3a] = -0x80;
    pcVar41[0x3b] = -1;
    pcVar41[0x3c] = '\0';
    pcVar41[0x3d] = '\0';
    pcVar41[0x3e] = -0x80;
    pcVar41[0x3f] = -1;
    pcVar41[0x80] = '\0';
    pcVar41[0x81] = '\0';
    pcVar41[0x82] = '\0';
    pcVar41[0x83] = '\0';
    pcVar41[0x84] = '\0';
    pcVar41[0x85] = '\0';
    pcVar41[0x86] = '\0';
    pcVar41[0x87] = '\0';
    pcVar41[0x88] = '\0';
    pcVar41[0x89] = '\0';
    pcVar41[0x8a] = '\0';
    pcVar41[0x8b] = '\0';
    pcVar41[0x8c] = '\0';
    pcVar41[0x8d] = '\0';
    pcVar41[0x8e] = '\0';
    pcVar41[0x8f] = '\0';
    pcVar41[0x90] = '\0';
    pcVar41[0x91] = '\0';
    pcVar41[0x92] = '\0';
    pcVar41[0x93] = '\0';
    pcVar41[0x94] = '\0';
    pcVar41[0x95] = '\0';
    pcVar41[0x96] = '\0';
    pcVar41[0x97] = '\0';
    pcVar41[0x98] = '\0';
    pcVar41[0x99] = '\0';
    pcVar41[0x9a] = '\0';
    pcVar41[0x9b] = '\0';
    pcVar41[0x9c] = '\0';
    pcVar41[0x9d] = '\0';
    pcVar41[0x9e] = '\0';
    pcVar41[0x9f] = '\0';
    pcVar41[0xa0] = '\0';
    pcVar41[0xa1] = '\0';
    pcVar41[0xa2] = '\0';
    pcVar41[0xa3] = '\0';
    pcVar41[0xa4] = '\0';
    pcVar41[0xa5] = '\0';
    pcVar41[0xa6] = '\0';
    pcVar41[0xa7] = '\0';
    pcVar41[0xa8] = '\0';
    pcVar41[0xa9] = '\0';
    pcVar41[0xaa] = '\0';
    pcVar41[0xab] = '\0';
    pcVar41[0xac] = '\0';
    pcVar41[0xad] = '\0';
    pcVar41[0xae] = '\0';
    pcVar41[0xaf] = '\0';
    pcVar41[0xb0] = '\0';
    pcVar41[0xb1] = '\0';
    pcVar41[0xb2] = '\0';
    pcVar41[0xb3] = '\0';
    pcVar41[0xb4] = '\0';
    pcVar41[0xb5] = '\0';
    pcVar41[0xb6] = '\0';
    pcVar41[0xb7] = '\0';
    pcVar41[0xb8] = '\0';
    pcVar41[0xb9] = '\0';
    pcVar41[0xba] = '\0';
    pcVar41[0xbb] = '\0';
    pcVar41[0xbc] = '\0';
    pcVar41[0xbd] = '\0';
    pcVar41[0xbe] = '\0';
    pcVar41[0xbf] = '\0';
    pcVar41[0xc0] = '\0';
    pcVar41[0xc1] = '\0';
    pcVar41[0xc2] = '\0';
    pcVar41[0xc3] = '\0';
    pcVar41[0xc4] = '\0';
    pcVar41[0xc5] = '\0';
    pcVar41[0xc6] = '\0';
    pcVar41[199] = '\0';
    pcVar41[200] = '\0';
    pcVar41[0xc9] = '\0';
    pcVar41[0xca] = '\0';
    pcVar41[0xcb] = '\0';
    pcVar41[0xcc] = '\0';
    pcVar41[0xcd] = '\0';
    pcVar41[0xce] = '\0';
    pcVar41[0xcf] = '\0';
    pcVar41[0xd0] = '\0';
    pcVar41[0xd1] = '\0';
    pcVar41[0xd2] = '\0';
    pcVar41[0xd3] = '\0';
    pcVar41[0xd4] = '\0';
    pcVar41[0xd5] = '\0';
    pcVar41[0xd6] = '\0';
    pcVar41[0xd7] = '\0';
    pcVar41[0xd8] = '\0';
    pcVar41[0xd9] = '\0';
    pcVar41[0xda] = '\0';
    pcVar41[0xdb] = '\0';
    pcVar41[0xdc] = '\0';
    pcVar41[0xdd] = '\0';
    pcVar41[0xde] = '\0';
    pcVar41[0xdf] = '\0';
    for (lVar30 = 0; lVar30 != 4; lVar30 = lVar30 + 1) {
      pcVar4 = pcVar41 + lVar30 * 8;
      pcVar4[0] = '\b';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
    }
    goto LAB_004c0830;
  }
  vc1.field_0._0_8_ = 0x100;
  pTVar10 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
    va1.field_0._8_1_ = 1;
    va1.field_0._0_8_ = pTVar10;
    MutexSys::lock(&pTVar10->mutex);
    if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar3 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar3 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
           ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar3 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar10->alloc0).bytesUsed = 0;
    (pTVar10->alloc0).bytesWasted = 0;
    (pTVar10->alloc0).end = 0;
    (pTVar10->alloc0).allocBlockSize = 0;
    (pTVar10->alloc0).ptr = (char *)0x0;
    (pTVar10->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar10->alloc1).bytesUsed = 0;
      (pTVar10->alloc1).bytesWasted = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).ptr = (char *)0x0;
      (pTVar10->alloc1).cur = 0;
    }
    else {
      (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar10->alloc1).ptr = (char *)0x0;
      (pTVar10->alloc1).cur = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).bytesUsed = 0;
      (pTVar10->alloc1).bytesWasted = 0;
      (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar10->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    vb1.field_0._0_8_ = pTVar10;
    vc0.field_0._8_1_ = 1;
    vc0.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&vb1);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&vc0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&va1);
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + vc1.field_0._0_8_;
  sVar36 = (alloc.talloc0)->cur;
  uVar48 = (ulong)(-(int)sVar36 & 0xf);
  uVar46 = sVar36 + vc1.field_0._0_8_ + uVar48;
  (alloc.talloc0)->cur = uVar46;
  if ((alloc.talloc0)->end < uVar46) {
    (alloc.talloc0)->cur = sVar36;
    if ((alloc.talloc0)->allocBlockSize < (ulong)(vc1.field_0._0_8_ << 2)) {
      pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc1);
    }
    else {
      vc0.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc0);
      (alloc.talloc0)->ptr = pcVar41;
      sVar36 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar36;
      (alloc.talloc0)->end = vc0.field_0._0_8_;
      (alloc.talloc0)->cur = vc1.field_0._0_8_;
      if ((ulong)vc0.field_0._0_8_ < (ulong)vc1.field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        vc0.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc0);
        (alloc.talloc0)->ptr = pcVar41;
        sVar36 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar36;
        (alloc.talloc0)->end = vc0.field_0._0_8_;
        (alloc.talloc0)->cur = vc1.field_0._0_8_;
        if ((ulong)vc0.field_0._0_8_ < (ulong)vc1.field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar41 = (char *)0x0;
          goto LAB_004c06a1;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar36;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar48;
    pcVar41 = (alloc.talloc0)->ptr + (uVar46 - vc1.field_0._0_8_);
  }
LAB_004c06a1:
  pcVar41[0xe0] = '\0';
  pcVar41[0xe1] = '\0';
  pcVar41[0xe2] = -0x80;
  pcVar41[0xe3] = '\x7f';
  pcVar41[0xe4] = '\0';
  pcVar41[0xe5] = '\0';
  pcVar41[0xe6] = -0x80;
  pcVar41[0xe7] = '\x7f';
  pcVar41[0xe8] = '\0';
  pcVar41[0xe9] = '\0';
  pcVar41[0xea] = -0x80;
  pcVar41[0xeb] = '\x7f';
  pcVar41[0xec] = '\0';
  pcVar41[0xed] = '\0';
  pcVar41[0xee] = -0x80;
  pcVar41[0xef] = '\x7f';
  pcVar41[0xf0] = '\0';
  pcVar41[0xf1] = '\0';
  pcVar41[0xf2] = -0x80;
  pcVar41[0xf3] = -1;
  pcVar41[0xf4] = '\0';
  pcVar41[0xf5] = '\0';
  pcVar41[0xf6] = -0x80;
  pcVar41[0xf7] = -1;
  pcVar41[0xf8] = '\0';
  pcVar41[0xf9] = '\0';
  pcVar41[0xfa] = -0x80;
  pcVar41[0xfb] = -1;
  pcVar41[0xfc] = '\0';
  pcVar41[0xfd] = '\0';
  pcVar41[0xfe] = -0x80;
  pcVar41[0xff] = -1;
  pcVar41[0x60] = '\0';
  pcVar41[0x61] = '\0';
  pcVar41[0x62] = -0x80;
  pcVar41[99] = '\x7f';
  pcVar41[100] = '\0';
  pcVar41[0x65] = '\0';
  pcVar41[0x66] = -0x80;
  pcVar41[0x67] = '\x7f';
  pcVar41[0x68] = '\0';
  pcVar41[0x69] = '\0';
  pcVar41[0x6a] = -0x80;
  pcVar41[0x6b] = '\x7f';
  pcVar41[0x6c] = '\0';
  pcVar41[0x6d] = '\0';
  pcVar41[0x6e] = -0x80;
  pcVar41[0x6f] = '\x7f';
  pcVar41[0x40] = '\0';
  pcVar41[0x41] = '\0';
  pcVar41[0x42] = -0x80;
  pcVar41[0x43] = '\x7f';
  pcVar41[0x44] = '\0';
  pcVar41[0x45] = '\0';
  pcVar41[0x46] = -0x80;
  pcVar41[0x47] = '\x7f';
  pcVar41[0x48] = '\0';
  pcVar41[0x49] = '\0';
  pcVar41[0x4a] = -0x80;
  pcVar41[0x4b] = '\x7f';
  pcVar41[0x4c] = '\0';
  pcVar41[0x4d] = '\0';
  pcVar41[0x4e] = -0x80;
  pcVar41[0x4f] = '\x7f';
  pcVar41[0x20] = '\0';
  pcVar41[0x21] = '\0';
  pcVar41[0x22] = -0x80;
  pcVar41[0x23] = '\x7f';
  pcVar41[0x24] = '\0';
  pcVar41[0x25] = '\0';
  pcVar41[0x26] = -0x80;
  pcVar41[0x27] = '\x7f';
  pcVar41[0x28] = '\0';
  pcVar41[0x29] = '\0';
  pcVar41[0x2a] = -0x80;
  pcVar41[0x2b] = '\x7f';
  pcVar41[0x2c] = '\0';
  pcVar41[0x2d] = '\0';
  pcVar41[0x2e] = -0x80;
  pcVar41[0x2f] = '\x7f';
  pcVar41[0x70] = '\0';
  pcVar41[0x71] = '\0';
  pcVar41[0x72] = -0x80;
  pcVar41[0x73] = -1;
  pcVar41[0x74] = '\0';
  pcVar41[0x75] = '\0';
  pcVar41[0x76] = -0x80;
  pcVar41[0x77] = -1;
  pcVar41[0x78] = '\0';
  pcVar41[0x79] = '\0';
  pcVar41[0x7a] = -0x80;
  pcVar41[0x7b] = -1;
  pcVar41[0x7c] = '\0';
  pcVar41[0x7d] = '\0';
  pcVar41[0x7e] = -0x80;
  pcVar41[0x7f] = -1;
  pcVar41[0x50] = '\0';
  pcVar41[0x51] = '\0';
  pcVar41[0x52] = -0x80;
  pcVar41[0x53] = -1;
  pcVar41[0x54] = '\0';
  pcVar41[0x55] = '\0';
  pcVar41[0x56] = -0x80;
  pcVar41[0x57] = -1;
  pcVar41[0x58] = '\0';
  pcVar41[0x59] = '\0';
  pcVar41[0x5a] = -0x80;
  pcVar41[0x5b] = -1;
  pcVar41[0x5c] = '\0';
  pcVar41[0x5d] = '\0';
  pcVar41[0x5e] = -0x80;
  pcVar41[0x5f] = -1;
  pcVar41[0x30] = '\0';
  pcVar41[0x31] = '\0';
  pcVar41[0x32] = -0x80;
  pcVar41[0x33] = -1;
  pcVar41[0x34] = '\0';
  pcVar41[0x35] = '\0';
  pcVar41[0x36] = -0x80;
  pcVar41[0x37] = -1;
  pcVar41[0x38] = '\0';
  pcVar41[0x39] = '\0';
  pcVar41[0x3a] = -0x80;
  pcVar41[0x3b] = -1;
  pcVar41[0x3c] = '\0';
  pcVar41[0x3d] = '\0';
  pcVar41[0x3e] = -0x80;
  pcVar41[0x3f] = -1;
  pcVar41[0x80] = '\0';
  pcVar41[0x81] = '\0';
  pcVar41[0x82] = '\0';
  pcVar41[0x83] = '\0';
  pcVar41[0x84] = '\0';
  pcVar41[0x85] = '\0';
  pcVar41[0x86] = '\0';
  pcVar41[0x87] = '\0';
  pcVar41[0x88] = '\0';
  pcVar41[0x89] = '\0';
  pcVar41[0x8a] = '\0';
  pcVar41[0x8b] = '\0';
  pcVar41[0x8c] = '\0';
  pcVar41[0x8d] = '\0';
  pcVar41[0x8e] = '\0';
  pcVar41[0x8f] = '\0';
  pcVar41[0x90] = '\0';
  pcVar41[0x91] = '\0';
  pcVar41[0x92] = '\0';
  pcVar41[0x93] = '\0';
  pcVar41[0x94] = '\0';
  pcVar41[0x95] = '\0';
  pcVar41[0x96] = '\0';
  pcVar41[0x97] = '\0';
  pcVar41[0x98] = '\0';
  pcVar41[0x99] = '\0';
  pcVar41[0x9a] = '\0';
  pcVar41[0x9b] = '\0';
  pcVar41[0x9c] = '\0';
  pcVar41[0x9d] = '\0';
  pcVar41[0x9e] = '\0';
  pcVar41[0x9f] = '\0';
  pcVar41[0xa0] = '\0';
  pcVar41[0xa1] = '\0';
  pcVar41[0xa2] = '\0';
  pcVar41[0xa3] = '\0';
  pcVar41[0xa4] = '\0';
  pcVar41[0xa5] = '\0';
  pcVar41[0xa6] = '\0';
  pcVar41[0xa7] = '\0';
  pcVar41[0xa8] = '\0';
  pcVar41[0xa9] = '\0';
  pcVar41[0xaa] = '\0';
  pcVar41[0xab] = '\0';
  pcVar41[0xac] = '\0';
  pcVar41[0xad] = '\0';
  pcVar41[0xae] = '\0';
  pcVar41[0xaf] = '\0';
  pcVar41[0xb0] = '\0';
  pcVar41[0xb1] = '\0';
  pcVar41[0xb2] = '\0';
  pcVar41[0xb3] = '\0';
  pcVar41[0xb4] = '\0';
  pcVar41[0xb5] = '\0';
  pcVar41[0xb6] = '\0';
  pcVar41[0xb7] = '\0';
  pcVar41[0xb8] = '\0';
  pcVar41[0xb9] = '\0';
  pcVar41[0xba] = '\0';
  pcVar41[0xbb] = '\0';
  pcVar41[0xbc] = '\0';
  pcVar41[0xbd] = '\0';
  pcVar41[0xbe] = '\0';
  pcVar41[0xbf] = '\0';
  pcVar41[0xc0] = '\0';
  pcVar41[0xc1] = '\0';
  pcVar41[0xc2] = '\0';
  pcVar41[0xc3] = '\0';
  pcVar41[0xc4] = '\0';
  pcVar41[0xc5] = '\0';
  pcVar41[0xc6] = '\0';
  pcVar41[199] = '\0';
  pcVar41[200] = '\0';
  pcVar41[0xc9] = '\0';
  pcVar41[0xca] = '\0';
  pcVar41[0xcb] = '\0';
  pcVar41[0xcc] = '\0';
  pcVar41[0xcd] = '\0';
  pcVar41[0xce] = '\0';
  pcVar41[0xcf] = '\0';
  pcVar41[0xd0] = '\0';
  pcVar41[0xd1] = '\0';
  pcVar41[0xd2] = '\0';
  pcVar41[0xd3] = '\0';
  pcVar41[0xd4] = '\0';
  pcVar41[0xd5] = '\0';
  pcVar41[0xd6] = '\0';
  pcVar41[0xd7] = '\0';
  pcVar41[0xd8] = '\0';
  pcVar41[0xd9] = '\0';
  pcVar41[0xda] = '\0';
  pcVar41[0xdb] = '\0';
  pcVar41[0xdc] = '\0';
  pcVar41[0xdd] = '\0';
  pcVar41[0xde] = '\0';
  pcVar41[0xdf] = '\0';
  _local_1ed8 = 6;
  for (lVar30 = 0; lVar30 != 4; lVar30 = lVar30 + 1) {
    pcVar4 = pcVar41 + lVar30 * 8;
    pcVar4[0] = '\b';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
  }
LAB_004c0830:
  _local_1ed8 = _local_1ed8 | (ulong)pcVar41;
  pBVar50 = &values[0].dt;
  uStack_1f30 = 0xff800000ff800000;
  local_1f38._0_8_ = (task_group_context *)0xff800000ff800000;
  auStack_1ee0 = (undefined1  [8])0x7f8000007f800000;
  local_1ee8 = (undefined1  [8])0x7f8000007f800000;
  for (uVar48 = 0; uVar26 = _local_1e68, auVar80 = _DAT_01f4b860, auVar85 = _DAT_01f4b850,
      uVar48 < children.numChildren; uVar48 = uVar48 + 1) {
    createLargeLeaf((NodeRecordMB4D *)&vc0,this,(BuildRecord *)_local_1e68,alloc);
    auVar85 = (undefined1  [16])vc0.field_0.field_0.x.field_0;
    pBVar50[-10].lower = (float)vc0.field_0._0_4_;
    pBVar50[-10].upper = (float)vc0.field_0._4_4_;
    *(vfloat_impl<4> *)(pBVar50 + -8) = vc0.field_0.field_0.y.field_0;
    *(vfloat_impl<4> *)(pBVar50 + -6) = vc0.field_0.field_0.z.field_0;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar50 + -4) = local_1c68;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar50 + -2) = local_1c58;
    pBVar50->lower = (float)local_1c48[0]._0_4_;
    pBVar50->upper = (float)local_1c48[0]._4_4_;
    _local_1ee8 = minps(_local_1ee8,(undefined1  [16])vc0.field_0.field_0.y.field_0);
    local_1f38 = maxps(local_1f38,(undefined1  [16])vc0.field_0.field_0.z.field_0);
    local_1f08 = minps(local_1f08,(undefined1  [16])local_1c68);
    _local_1ec8 = maxps(_local_1ec8,(undefined1  [16])local_1c58);
    _local_1e68 = uVar26 + 0xf0;
    pBVar50 = pBVar50 + 0xc;
    vc0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)auVar85;
  }
  uVar48 = (ulong)pcVar41 & 0xfffffffffffffff0;
  if (((uint)_local_1ed8 & 0xf) == 1) {
    pfVar37 = &values[0].dt.upper;
    for (sVar36 = 0; children.numChildren != sVar36; sVar36 = sVar36 + 1) {
      *(undefined8 *)(uVar48 + sVar36 * 8) = *(undefined8 *)(pfVar37 + -0x15);
      fVar82 = ((BBox1f *)(pfVar37 + -1))->lower;
      fVar81 = 1.0 / (*pfVar37 - fVar82);
      fVar88 = -fVar82 * fVar81;
      fVar76 = 1.0 - fVar88;
      auVar70._0_4_ = pfVar37[-0x11] * fVar76 + pfVar37[-9] * fVar88;
      auVar70._4_4_ = pfVar37[-0x10] * fVar76 + pfVar37[-8] * fVar88;
      auVar70._8_4_ = pfVar37[-0xf] * fVar76 + pfVar37[-7] * fVar88;
      auVar70._12_4_ = pfVar37[-0xe] * fVar76 + pfVar37[-6] * fVar88;
      auVar77._0_4_ = fVar76 * pfVar37[-0xd] + fVar88 * pfVar37[-5];
      auVar77._4_4_ = fVar76 * pfVar37[-0xc] + fVar88 * pfVar37[-4];
      auVar77._8_4_ = fVar76 * pfVar37[-0xb] + fVar88 * pfVar37[-3];
      auVar77._12_4_ = fVar76 * pfVar37[-10] + fVar88 * pfVar37[-2];
      fVar81 = (1.0 - fVar82) * fVar81;
      fVar82 = 1.0 - fVar81;
      auVar84._0_4_ = pfVar37[-0x11] * fVar82 + pfVar37[-9] * fVar81;
      auVar84._4_4_ = pfVar37[-0x10] * fVar82 + pfVar37[-8] * fVar81;
      auVar84._8_4_ = pfVar37[-0xf] * fVar82 + pfVar37[-7] * fVar81;
      auVar84._12_4_ = pfVar37[-0xe] * fVar82 + pfVar37[-6] * fVar81;
      auVar83._0_4_ = fVar82 * pfVar37[-0xd] + fVar81 * pfVar37[-5];
      auVar83._4_4_ = fVar82 * pfVar37[-0xc] + fVar81 * pfVar37[-4];
      auVar83._8_4_ = fVar82 * pfVar37[-0xb] + fVar81 * pfVar37[-3];
      auVar83._12_4_ = fVar82 * pfVar37[-10] + fVar81 * pfVar37[-2];
      auVar71 = minps(auVar70,auVar80);
      auVar78 = maxps(auVar77,auVar85);
      auVar65 = minps(auVar84,auVar80);
      auVar84 = maxps(auVar83,auVar85);
      fVar82 = auVar71._0_4_ - ABS(auVar71._0_4_) * 4.7683716e-07;
      fVar76 = auVar71._4_4_ - ABS(auVar71._4_4_) * 4.7683716e-07;
      fVar81 = auVar71._8_4_ - ABS(auVar71._8_4_) * 4.7683716e-07;
      fVar88 = ABS(auVar78._0_4_) * 4.7683716e-07 + auVar78._0_4_;
      fVar86 = ABS(auVar78._4_4_) * 4.7683716e-07 + auVar78._4_4_;
      fVar87 = ABS(auVar78._8_4_) * 4.7683716e-07 + auVar78._8_4_;
      *(float *)(uVar48 + 0x20 + sVar36 * 4) = fVar82;
      *(float *)(uVar48 + 0x40 + sVar36 * 4) = fVar76;
      *(float *)(uVar48 + 0x60 + sVar36 * 4) = fVar81;
      *(float *)(uVar48 + 0x30 + sVar36 * 4) = fVar88;
      *(float *)(uVar48 + 0x50 + sVar36 * 4) = fVar86;
      *(float *)(uVar48 + 0x70 + sVar36 * 4) = fVar87;
      *(float *)(uVar48 + 0x80 + sVar36 * 4) =
           (auVar65._0_4_ - ABS(auVar65._0_4_) * 4.7683716e-07) - fVar82;
      *(float *)(uVar48 + 0xa0 + sVar36 * 4) =
           (auVar65._4_4_ - ABS(auVar65._4_4_) * 4.7683716e-07) - fVar76;
      *(float *)(uVar48 + 0xc0 + sVar36 * 4) =
           (auVar65._8_4_ - ABS(auVar65._8_4_) * 4.7683716e-07) - fVar81;
      *(float *)(uVar48 + 0x90 + sVar36 * 4) =
           (ABS(auVar84._0_4_) * 4.7683716e-07 + auVar84._0_4_) - fVar88;
      *(float *)(uVar48 + 0xb0 + sVar36 * 4) =
           (ABS(auVar84._4_4_) * 4.7683716e-07 + auVar84._4_4_) - fVar86;
      *(float *)(uVar48 + 0xd0 + sVar36 * 4) =
           (ABS(auVar84._8_4_) * 4.7683716e-07 + auVar84._8_4_) - fVar87;
      pfVar37 = pfVar37 + 0x18;
    }
  }
  else {
    pfVar37 = &values[0].dt.upper;
    for (sVar36 = 0; children.numChildren != sVar36; sVar36 = sVar36 + 1) {
      *(undefined8 *)(uVar48 + sVar36 * 8) = *(undefined8 *)(pfVar37 + -0x15);
      fVar82 = *pfVar37;
      fVar76 = ((BBox1f *)(pfVar37 + -1))->lower;
      fVar88 = 1.0 / (fVar82 - fVar76);
      fVar86 = -fVar76 * fVar88;
      fVar81 = 1.0 - fVar86;
      auVar65._0_4_ = pfVar37[-0x11] * fVar81 + pfVar37[-9] * fVar86;
      auVar65._4_4_ = pfVar37[-0x10] * fVar81 + pfVar37[-8] * fVar86;
      auVar65._8_4_ = pfVar37[-0xf] * fVar81 + pfVar37[-7] * fVar86;
      auVar65._12_4_ = pfVar37[-0xe] * fVar81 + pfVar37[-6] * fVar86;
      auVar71._0_4_ = fVar81 * pfVar37[-0xd] + fVar86 * pfVar37[-5];
      auVar71._4_4_ = fVar81 * pfVar37[-0xc] + fVar86 * pfVar37[-4];
      auVar71._8_4_ = fVar81 * pfVar37[-0xb] + fVar86 * pfVar37[-3];
      auVar71._12_4_ = fVar81 * pfVar37[-10] + fVar86 * pfVar37[-2];
      fVar88 = (1.0 - fVar76) * fVar88;
      fVar81 = 1.0 - fVar88;
      auVar80._0_4_ = pfVar37[-0x11] * fVar81 + pfVar37[-9] * fVar88;
      auVar80._4_4_ = pfVar37[-0x10] * fVar81 + pfVar37[-8] * fVar88;
      auVar80._8_4_ = pfVar37[-0xf] * fVar81 + pfVar37[-7] * fVar88;
      auVar80._12_4_ = pfVar37[-0xe] * fVar81 + pfVar37[-6] * fVar88;
      auVar78._0_4_ = fVar81 * pfVar37[-0xd] + fVar88 * pfVar37[-5];
      auVar78._4_4_ = fVar81 * pfVar37[-0xc] + fVar88 * pfVar37[-4];
      auVar78._8_4_ = fVar81 * pfVar37[-0xb] + fVar88 * pfVar37[-3];
      auVar78._12_4_ = fVar81 * pfVar37[-10] + fVar88 * pfVar37[-2];
      auVar65 = minps(auVar65,_DAT_01f4b860);
      auVar71 = maxps(auVar71,auVar85);
      auVar80 = minps(auVar80,_DAT_01f4b860);
      auVar78 = maxps(auVar78,auVar85);
      fVar87 = auVar65._0_4_ - ABS(auVar65._0_4_) * 4.7683716e-07;
      fVar90 = auVar65._4_4_ - ABS(auVar65._4_4_) * 4.7683716e-07;
      fVar91 = auVar65._8_4_ - ABS(auVar65._8_4_) * 4.7683716e-07;
      fVar81 = ABS(auVar71._0_4_) * 4.7683716e-07 + auVar71._0_4_;
      fVar88 = ABS(auVar71._4_4_) * 4.7683716e-07 + auVar71._4_4_;
      fVar86 = ABS(auVar71._8_4_) * 4.7683716e-07 + auVar71._8_4_;
      *(float *)(uVar48 + 0x20 + sVar36 * 4) = fVar87;
      *(float *)(uVar48 + 0x40 + sVar36 * 4) = fVar90;
      *(float *)(uVar48 + 0x60 + sVar36 * 4) = fVar91;
      *(float *)(uVar48 + 0x30 + sVar36 * 4) = fVar81;
      *(float *)(uVar48 + 0x50 + sVar36 * 4) = fVar88;
      *(float *)(uVar48 + 0x70 + sVar36 * 4) = fVar86;
      *(float *)(uVar48 + 0x80 + sVar36 * 4) =
           (auVar80._0_4_ - ABS(auVar80._0_4_) * 4.7683716e-07) - fVar87;
      *(float *)(uVar48 + 0xa0 + sVar36 * 4) =
           (auVar80._4_4_ - ABS(auVar80._4_4_) * 4.7683716e-07) - fVar90;
      *(float *)(uVar48 + 0xc0 + sVar36 * 4) =
           (auVar80._8_4_ - ABS(auVar80._8_4_) * 4.7683716e-07) - fVar91;
      *(float *)(uVar48 + 0x90 + sVar36 * 4) =
           (ABS(auVar78._0_4_) * 4.7683716e-07 + auVar78._0_4_) - fVar81;
      *(float *)(uVar48 + 0xb0 + sVar36 * 4) =
           (ABS(auVar78._4_4_) * 4.7683716e-07 + auVar78._4_4_) - fVar88;
      *(float *)(uVar48 + 0xd0 + sVar36 * 4) =
           (ABS(auVar78._8_4_) * 4.7683716e-07 + auVar78._8_4_) - fVar86;
      *(float *)(uVar48 + 0xe0 + sVar36 * 4) = fVar76;
      *(uint *)(uVar48 + 0xf0 + sVar36 * 4) =
           ~-(uint)(fVar82 == 1.0) & (uint)fVar82 | -(uint)(fVar82 == 1.0) & 0x3f800001;
      pfVar37 = pfVar37 + 0x18;
    }
  }
  if ((uVar51 & 1) == 0) {
    (local_1eb8->ref).ptr = _local_1ed8;
    *(undefined1 (*) [8])&(local_1eb8->lbounds).bounds0.lower.field_0 = local_1ee8;
    *(undefined1 (*) [8])((long)&(local_1eb8->lbounds).bounds0.lower.field_0 + 8) = auStack_1ee0;
    *(task_group_context **)&(local_1eb8->lbounds).bounds0.upper.field_0 = local_1f38._0_8_;
    *(undefined8 *)((long)&(local_1eb8->lbounds).bounds0.upper.field_0 + 8) = uStack_1f30;
    *(undefined8 *)&(local_1eb8->lbounds).bounds1.lower.field_0 = local_1f08._0_8_;
    *(undefined8 *)((long)&(local_1eb8->lbounds).bounds1.lower.field_0 + 8) = local_1f08._8_8_;
    local_1e28[0]._0_8_ = local_1ec8;
    local_1e28[0]._8_8_ = uStack_1ec0;
  }
  else {
    bupper1.lower.field_0._8_8_ = &this->recalculatePrimRef;
    bupper1.lower.field_0._0_8_ = &current.super_BuildRecord.prims;
    va1.field_0._8_8_ = 0x7f8000007f800000;
    va1.field_0._0_8_ = 0x7f8000007f800000;
    va1.field_0._24_8_ = 0xff800000ff800000;
    va1.field_0._16_8_ = 0xff800000ff800000;
    va1.field_0._40_8_ = 0x7f8000007f800000;
    va1.field_0._32_8_ = 0x7f8000007f800000;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      vc0.field_0._8_8_ = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      vc0.field_0._0_8_ = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&vb1,(anon_class_16_2_aeee9775 *)&bupper1,(range<unsigned_long> *)&vc0)
      ;
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&vc0,(context_traits)0x4,CUSTOM_CTX);
      vc1.field_0._8_8_ = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      vc1.field_0._0_8_ = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      vc1.field_0._16_8_ = 0x400;
      blower0.lower.field_0._0_8_ = &blower1;
      blower0.lower.field_0._8_8_ = &bupper1;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&vb1,(d1 *)&vc1,(blocked_range<unsigned_long> *)&va1,
                 (LBBox<embree::Vec3fa> *)&blower0,
                 (anon_class_16_2_ed117de8_conflict31 *)blower0.lower.field_0._0_8_,
                 (anon_class_1_0_00000001 *)&vc0,local_1f38._0_8_);
      cVar27 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vc0);
      if (cVar27 != '\0') {
        prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar33,"task cancelled");
        __cxa_throw(prVar33,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vc0);
    }
    (local_1eb8->ref).ptr = _local_1ed8;
    *(undefined8 *)&(local_1eb8->lbounds).bounds0.lower.field_0 = vb1.field_0._0_8_;
    *(undefined8 *)((long)&(local_1eb8->lbounds).bounds0.lower.field_0 + 8) = vb1.field_0._8_8_;
    *(undefined8 *)&(local_1eb8->lbounds).bounds0.upper.field_0 = vb1.field_0._16_8_;
    *(undefined8 *)((long)&(local_1eb8->lbounds).bounds0.upper.field_0 + 8) = vb1.field_0._24_8_;
    *(undefined8 *)&(local_1eb8->lbounds).bounds1.lower.field_0 = vb1.field_0._32_8_;
    *(undefined8 *)((long)&(local_1eb8->lbounds).bounds1.lower.field_0 + 8) = vb1.field_0._40_8_;
  }
  *(undefined8 *)&(local_1eb8->lbounds).bounds1.upper.field_0 = local_1e28[0]._0_8_;
  *(undefined8 *)((long)&(local_1eb8->lbounds).bounds1.upper.field_0 + 8) = local_1e28[0]._8_8_;
  BVar23.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  BVar23.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
  local_1eb8->dt = BVar23;
  for (uVar51 = 0; uVar51 < children.numChildren; uVar51 = uVar51 + 1) {
    pSVar6 = children.primvecs.items[uVar51];
    psVar2 = &pSVar6->refCount;
    *psVar2 = *psVar2 - 1;
    if (*psVar2 == 0) {
      pvVar35 = pSVar6->prims;
      if (pvVar35 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar36 = pvVar35->size_alloced;
        pPVar7 = pvVar35->items;
        if (pPVar7 != (PrimRefMB *)0x0) {
          if (sVar36 * 0x50 < 0x1c00000) {
            alignedFree(pPVar7);
          }
          else {
            os_free(pPVar7,sVar36 * 0x50,(pvVar35->alloc).hugepages);
          }
        }
        if (sVar36 != 0) {
          pMVar8 = (pvVar35->alloc).device;
          (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar36 * -0x50,1);
        }
        pvVar35->size_active = 0;
        pvVar35->size_alloced = 0;
        pvVar35->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar35);
    }
  }
  return local_1eb8;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }